

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

boolean u_slip_free(monst *mtmp,attack *mattk)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  obj *obj;
  boolean bVar4;
  char *pcVar5;
  char *pcVar6;
  
  obj = uarmc;
  if (uarmc == (obj *)0x0) {
    obj = uarm;
  }
  if (obj == (obj *)0x0) {
    obj = uarmu;
  }
  if (mattk->adtyp == ' ') {
    obj = uarmh;
  }
  if ((obj == (obj *)0x0) ||
     (((((*(uint *)&obj->field_0x4a >> 0x14 & 1) == 0 && (obj->otyp != 0x80)) &&
       ((obj->oprops & 0x40) == 0)) ||
      (((*(uint *)&obj->field_0x4a & 1) != 0 &&
       (uVar1 = mt_random(), uVar1 * -0x55555555 < 0x55555556)))))) {
    bVar4 = '\0';
  }
  else {
    pcVar2 = Monnam(mtmp);
    pcVar6 = "grabs you, but cannot hold onto";
    if (mattk->adtyp == '\x1c') {
      pcVar6 = "slips off of";
    }
    pcVar5 = "greased";
    if (((*(uint *)&obj->field_0x4a & 0x100000) == 0) &&
       (pcVar5 = "slippery", (objects[obj->otyp].field_0x10 & 1) == 0)) {
      pcVar3 = cloak_simple_name(obj);
    }
    else {
      pcVar3 = xname(obj);
    }
    pline("%s %s your %s %s!",pcVar2,pcVar6,pcVar5,pcVar3);
    bVar4 = '\x01';
    if (((obj->field_0x4c & 0x10) != 0) && (uVar1 = mt_random(), (uVar1 & 1) == 0)) {
      pline("The grease wears off.");
      obj->field_0x4c = obj->field_0x4c & 0xef;
      update_inventory();
    }
  }
  return bVar4;
}

Assistant:

static boolean u_slip_free(struct monst *mtmp, const struct attack *mattk)
{
	struct obj *obj = (uarmc ? uarmc : uarm);

	if (!obj) obj = uarmu;
	if (mattk->adtyp == AD_DRIN) obj = uarmh;

	/* if your cloak/armor is greased, monster slips off; this
	   protection might fail (33% chance) when the armor is cursed */
	if (obj && (obj->greased || obj->otyp == OILSKIN_CLOAK ||
		    (obj->oprops & ITEM_OILSKIN)) &&
		(!obj->cursed || rn2(3))) {
	    pline("%s %s your %s %s!",
		  Monnam(mtmp),
		  (mattk->adtyp == AD_WRAP) ?
			"slips off of" : "grabs you, but cannot hold onto",
		  obj->greased ? "greased" : "slippery",
		  /* avoid "slippery slippery cloak"
		     for undiscovered oilskin cloak */
		  (obj->greased || objects[obj->otyp].oc_name_known) ?
			xname(obj) : cloak_simple_name(obj));

	    if (obj->greased && !rn2(2)) {
		pline("The grease wears off.");
		obj->greased = 0;
		update_inventory();
	    }
	    return TRUE;
	}
	return FALSE;
}